

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::clearFile(FileServer *this,TURI *uri)

{
  bool bVar1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  pthread_mutex_t *__mutex;
  size_type __n;
  long lVar3;
  reference rVar4;
  allocator local_91;
  undefined1 local_90 [72];
  int32_t local_48;
  pointer local_40;
  pointer pcStack_38;
  pointer local_30;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  lVar3 = -0x68;
  __n = 0xffffffffffffffff;
  do {
    __n = __n + 1;
    _Var2._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    if ((long)(int)((*(int *)&((_Bit_iterator *)((long)&(_Var2._M_head_impl)->fileUsed + 0x10))->
                              super__Bit_iterator_base -
                    *(int *)&((_Var2._M_head_impl)->fileUsed).
                             super__Bvector_base<std::allocator<bool>_>) * 8 +
                   *(uint *)((long)&(_Var2._M_head_impl)->fileUsed + 0x18)) <= (long)__n)
    goto LAB_0011123f;
    lVar3 = lVar3 + 0x68;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&((_Var2._M_head_impl)->files).
                                       super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                            + lVar3),uri);
  } while (bVar1);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&((this->m_impl)._M_t.
                       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                      fileUsed,__n);
  *rVar4._M_p = *rVar4._M_p & ~rVar4._M_mask;
  std::__cxx11::string::string((string *)local_90,"?",&local_91);
  local_90._32_8_ = 0;
  std::__cxx11::string::string((string *)(local_90 + 0x28),"?",&local_91);
  local_48 = 0;
  local_30 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  FileData::operator=((FileData *)
                      (lVar3 + *(long *)&(((this->m_impl)._M_t.
                                           super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                                           .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>
                                          ._M_head_impl)->files).
                                         super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                      ),(FileData *)local_90);
  FileData::~FileData((FileData *)local_90);
  _Var2._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
LAB_0011123f:
  (_Var2._M_head_impl)->changedFileInfos = true;
  pthread_mutex_unlock(__mutex);
  return true;
}

Assistant:

bool FileServer::clearFile(const TURI & uri) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            if (m_impl->files[i].info.uri != uri) {
                continue;
            }
            m_impl->fileUsed[i] = false;
            m_impl->files[i] = {};

            break;
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}